

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_leaf(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  size_t __n;
  bool bVar4;
  uint local_a4;
  uint local_94;
  size_t len;
  char *p;
  LY_DATA_TYPE local_70;
  LY_DATA_TYPE datatype;
  uint32_t i;
  uint32_t ns_count;
  char *xml_expr;
  char **nss;
  char **prefs;
  char *mod_name;
  char *ns;
  lys_type *type;
  lyd_node_leaf_list *iter;
  lyd_node_leaf_list *leaf;
  int options_local;
  int toplevel_local;
  lyd_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  iter = (lyd_node_leaf_list *)node;
  leaf._0_4_ = options;
  leaf._4_4_ = toplevel;
  _options_local = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
     (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
    if (node_local._4_4_ == 0) {
      local_a4 = 0;
    }
    else {
      local_a4 = node_local._4_4_ * 2 - 2;
    }
    ly_print(plStack_10,"%*s<%s",(ulong)local_a4,"",_options_local->schema->name);
  }
  else {
    plVar2 = lyd_node_module(_options_local);
    mod_name = plVar2->ns;
    if (node_local._4_4_ == 0) {
      local_94 = 0;
    }
    else {
      local_94 = node_local._4_4_ * 2 - 2;
    }
    ly_print(plStack_10,"%*s<%s xmlns=\"%s\"",(ulong)local_94,"",_options_local->schema->name,
             mod_name);
  }
  if (leaf._4_4_ != 0) {
    xml_print_ns(plStack_10,_options_local,(int)leaf);
  }
  xml_print_attrs(plStack_10,_options_local,(int)leaf);
  p._4_4_ = (uint)iter->value_type & 0x3f;
  do {
    switch(p._4_4_) {
    case LY_TYPE_BINARY:
    case LY_TYPE_BITS:
    case LY_TYPE_BOOL:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_STRING:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      if ((iter->value_str == (char *)0x0) || (*iter->value_str == '\0')) {
        ly_print(plStack_10,"/>");
      }
      else {
        ly_print(plStack_10,">");
        lyxml_dump_text(plStack_10,iter->value_str);
        ly_print(plStack_10,"</%s>",_options_local->schema->name);
      }
LAB_001b9a92:
      if (node_local._4_4_ != 0) {
        ly_print(plStack_10,"\n");
      }
      return;
    case LY_TYPE_EMPTY:
      ly_print(plStack_10,"/>");
      goto LAB_001b9a92;
    case LY_TYPE_IDENT:
      if ((iter->value_str == (char *)0x0) || (*iter->value_str == '\0')) {
        ly_print(plStack_10,"/>");
        goto LAB_001b9a92;
      }
      pcVar3 = strchr(iter->value_str,0x3a);
      if (pcVar3 == (char *)0x0) {
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                      ,0x13d,
                      "void xml_print_leaf(struct lyout *, int, const struct lyd_node *, int, int)")
        ;
      }
      __n = (long)pcVar3 - (long)iter->value_str;
      prefs = (char **)iter->schema->module->name;
      iVar1 = strncmp(iter->value_str,(char *)prefs,__n);
      if ((iVar1 == 0) && (*(char *)((long)prefs + __n) == '\0')) {
        ly_print(plStack_10,">");
        lyxml_dump_text(plStack_10,pcVar3 + 1);
        ly_print(plStack_10,"</%s>",_options_local->schema->name);
        goto LAB_001b9a92;
      }
      p._4_4_ = LY_TYPE_INST;
      break;
    case LY_TYPE_INST:
      _i = transform_json2xml(_options_local->schema->module,(char *)_options_local->child,&nss,
                              (char ***)&xml_expr,(uint32_t *)&datatype);
      if (_i == (char *)0x0) {
        ly_print(plStack_10,"\"(!error!)\"");
        return;
      }
      for (local_70 = LY_TYPE_DER; (uint)local_70 < (uint)datatype;
          local_70 = local_70 + LY_TYPE_BINARY) {
        ly_print(plStack_10," xmlns:%s=\"%s\"",nss[(uint)local_70],
                 *(undefined8 *)(xml_expr + (ulong)(uint)local_70 * 8));
      }
      free(nss);
      free(xml_expr);
      if (*_i == '\0') {
        ly_print(plStack_10,"/>");
      }
      else {
        ly_print(plStack_10,">");
        lyxml_dump_text(plStack_10,_i);
        ly_print(plStack_10,"</%s>",_options_local->schema->name);
      }
      lydict_remove(_options_local->schema->module->ctx,_i);
      goto LAB_001b9a92;
    case LY_TYPE_LEAFREF:
      type = (lys_type *)(iter->value).enm;
      while( true ) {
        bVar4 = false;
        if (type != (lys_type *)0x0) {
          bVar4 = *(short *)&type[1].module_name == 9;
        }
        if (!bVar4) break;
        type = (lys_type *)(type->info).dec64.div;
      }
      if (type == (lys_type *)0x0) {
        ns = (char *)lyd_leaf_type(iter);
        if ((lys_type *)ns == (lys_type *)0x0) {
          ly_print(plStack_10,"\"(!error!)\"");
          return;
        }
        p._4_4_ = ((lys_type *)ns)->base;
      }
      else {
        p._4_4_ = (uint)*(ushort *)&type[1].module_name & 0x3f;
      }
      break;
    default:
      ly_print(plStack_10,"\"(!error!)\"");
      goto LAB_001b9a92;
    }
  } while( true );
}

Assistant:

static void
xml_print_leaf(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    const struct lyd_node_leaf_list *leaf = (struct lyd_node_leaf_list *)node, *iter;
    const struct lys_type *type;
    const char *ns, *mod_name;
    const char **prefs, **nss;
    const char *xml_expr;
    uint32_t ns_count, i;
    LY_DATA_TYPE datatype;
    char *p;
    size_t len;

    if (toplevel || !node->parent || nscmp(node, node->parent)) {
        /* print "namespace" */
        ns = lyd_node_module(node)->ns;
        ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
    } else {
        ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
    }

    if (toplevel) {
        xml_print_ns(out, node, options);
    }

    xml_print_attrs(out, node, options);
    datatype = leaf->value_type & LY_DATA_TYPE_MASK;
printvalue:
    switch (datatype) {
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
    case LY_TYPE_BOOL:
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (!leaf->value_str || !leaf->value_str[0]) {
            ly_print(out, "/>");
        } else {
            ly_print(out, ">");
            lyxml_dump_text(out, leaf->value_str);
            ly_print(out, "</%s>", node->schema->name);
        }
        break;

    case LY_TYPE_IDENT:
        if (!leaf->value_str || !leaf->value_str[0]) {
            ly_print(out, "/>");
            break;
        }
        p = strchr(leaf->value_str, ':');
        assert(p);
        len = p - leaf->value_str;
        mod_name = leaf->schema->module->name;
        if (!strncmp(leaf->value_str, mod_name, len) && !mod_name[len]) {
            ly_print(out, ">");
            lyxml_dump_text(out, ++p);
            ly_print(out, "</%s>", node->schema->name);
        } else {
            /* avoid code duplication - use instance-identifier printer which gets necessary namespaces to print */
            datatype = LY_TYPE_INST;
            goto printvalue;
        }
        break;
    case LY_TYPE_INST:
        xml_expr = transform_json2xml(node->schema->module, ((struct lyd_node_leaf_list *)node)->value_str,
                                      &prefs, &nss, &ns_count);
        if (!xml_expr) {
            /* error */
            ly_print(out, "\"(!error!)\"");
            return;
        }

        for (i = 0; i < ns_count; ++i) {
            ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
        }
        free(prefs);
        free(nss);

        if (xml_expr[0]) {
            ly_print(out, ">");
            lyxml_dump_text(out, xml_expr);
            ly_print(out, "</%s>", node->schema->name);
        } else {
            ly_print(out, "/>");
        }
        lydict_remove(node->schema->module->ctx, xml_expr);
        break;

    case LY_TYPE_LEAFREF:
        iter = (struct lyd_node_leaf_list *)leaf->value.leafref;
        while (iter && (iter->value_type == LY_TYPE_LEAFREF)) {
            iter = (struct lyd_node_leaf_list *)iter->value.leafref;
        }
        if (!iter) {
            /* unresolved and invalid, but we can learn the correct type anyway */
            type = lyd_leaf_type((struct lyd_node_leaf_list *)leaf);
            if (!type) {
                /* error */
                ly_print(out, "\"(!error!)\"");
                return;
            }
            datatype = type->base;
        } else {
            datatype = iter->value_type & LY_DATA_TYPE_MASK;
        }
        goto printvalue;

    case LY_TYPE_EMPTY:
        ly_print(out, "/>");
        break;

    default:
        /* error */
        ly_print(out, "\"(!error!)\"");
    }

    if (level) {
        ly_print(out, "\n");
    }
}